

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>
          (MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
           *this,VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 *header,
          VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
          *message)

{
  Visitor *this_00;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  local_4c8;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  local_2c0;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *local_28;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *message_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  *header_local;
  MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
  *this_local;
  
  this_00 = *(Visitor **)(this + 8);
  local_28 = message;
  message_local =
       (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
        *)header;
  header_local = (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                  *)this;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  ::VersionnedMessageRef(&local_2c0,header);
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'9'>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  ::VersionnedMessageRef(&local_4c8,local_28);
  should_visit_incremental_refresh_frame::Visitor::operator()(this_00,&local_2c0,&local_4c8);
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'9'>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  ::~VersionnedMessageRef(&local_4c8);
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  ::~VersionnedMessageRef(&local_2c0);
  return;
}

Assistant:

void callVisitor(const Header& header, const Message& message, std::true_type /* is_void */)
            {
                visitor(header, message);
            }